

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

string * systemWithOutput(string *__return_storage_ptr__,string *command)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  runtime_error *prVar3;
  long *plVar4;
  size_type *psVar5;
  char acStack_158 [8];
  array<char,_128UL> buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  size_type *local_50;
  string result;
  
  buffer._M_elems[0x68] = '\0';
  buffer._M_elems[0x69] = '\0';
  buffer._M_elems[0x6a] = '\0';
  buffer._M_elems[0x6b] = '\0';
  buffer._M_elems[0x6c] = '\0';
  buffer._M_elems[0x6d] = '\0';
  buffer._M_elems[0x6e] = '\0';
  buffer._M_elems[0x6f] = '\0';
  buffer._M_elems[0x70] = '\0';
  buffer._M_elems[0x71] = '\0';
  buffer._M_elems[0x72] = '\0';
  buffer._M_elems[0x73] = '\0';
  buffer._M_elems[0x74] = '\0';
  buffer._M_elems[0x75] = '\0';
  buffer._M_elems[0x76] = '\0';
  buffer._M_elems[0x77] = '\0';
  buffer._M_elems[0x58] = '\0';
  buffer._M_elems[0x59] = '\0';
  buffer._M_elems[0x5a] = '\0';
  buffer._M_elems[0x5b] = '\0';
  buffer._M_elems[0x5c] = '\0';
  buffer._M_elems[0x5d] = '\0';
  buffer._M_elems[0x5e] = '\0';
  buffer._M_elems[0x5f] = '\0';
  buffer._M_elems[0x60] = '\0';
  buffer._M_elems[0x61] = '\0';
  buffer._M_elems[0x62] = '\0';
  buffer._M_elems[99] = '\0';
  buffer._M_elems[100] = '\0';
  buffer._M_elems[0x65] = '\0';
  buffer._M_elems[0x66] = '\0';
  buffer._M_elems[0x67] = '\0';
  buffer._M_elems[0x48] = '\0';
  buffer._M_elems[0x49] = '\0';
  buffer._M_elems[0x4a] = '\0';
  buffer._M_elems[0x4b] = '\0';
  buffer._M_elems[0x4c] = '\0';
  buffer._M_elems[0x4d] = '\0';
  buffer._M_elems[0x4e] = '\0';
  buffer._M_elems[0x4f] = '\0';
  buffer._M_elems[0x50] = '\0';
  buffer._M_elems[0x51] = '\0';
  buffer._M_elems[0x52] = '\0';
  buffer._M_elems[0x53] = '\0';
  buffer._M_elems[0x54] = '\0';
  buffer._M_elems[0x55] = '\0';
  buffer._M_elems[0x56] = '\0';
  buffer._M_elems[0x57] = '\0';
  buffer._M_elems[0x38] = '\0';
  buffer._M_elems[0x39] = '\0';
  buffer._M_elems[0x3a] = '\0';
  buffer._M_elems[0x3b] = '\0';
  buffer._M_elems[0x3c] = '\0';
  buffer._M_elems[0x3d] = '\0';
  buffer._M_elems[0x3e] = '\0';
  buffer._M_elems[0x3f] = '\0';
  buffer._M_elems[0x40] = '\0';
  buffer._M_elems[0x41] = '\0';
  buffer._M_elems[0x42] = '\0';
  buffer._M_elems[0x43] = '\0';
  buffer._M_elems[0x44] = '\0';
  buffer._M_elems[0x45] = '\0';
  buffer._M_elems[0x46] = '\0';
  buffer._M_elems[0x47] = '\0';
  buffer._M_elems[0x28] = '\0';
  buffer._M_elems[0x29] = '\0';
  buffer._M_elems[0x2a] = '\0';
  buffer._M_elems[0x2b] = '\0';
  buffer._M_elems[0x2c] = '\0';
  buffer._M_elems[0x2d] = '\0';
  buffer._M_elems[0x2e] = '\0';
  buffer._M_elems[0x2f] = '\0';
  buffer._M_elems[0x30] = '\0';
  buffer._M_elems[0x31] = '\0';
  buffer._M_elems[0x32] = '\0';
  buffer._M_elems[0x33] = '\0';
  buffer._M_elems[0x34] = '\0';
  buffer._M_elems[0x35] = '\0';
  buffer._M_elems[0x36] = '\0';
  buffer._M_elems[0x37] = '\0';
  buffer._M_elems[0x18] = '\0';
  buffer._M_elems[0x19] = '\0';
  buffer._M_elems[0x1a] = '\0';
  buffer._M_elems[0x1b] = '\0';
  buffer._M_elems[0x1c] = '\0';
  buffer._M_elems[0x1d] = '\0';
  buffer._M_elems[0x1e] = '\0';
  buffer._M_elems[0x1f] = '\0';
  buffer._M_elems[0x20] = '\0';
  buffer._M_elems[0x21] = '\0';
  buffer._M_elems[0x22] = '\0';
  buffer._M_elems[0x23] = '\0';
  buffer._M_elems[0x24] = '\0';
  buffer._M_elems[0x25] = '\0';
  buffer._M_elems[0x26] = '\0';
  buffer._M_elems[0x27] = '\0';
  buffer._M_elems[8] = '\0';
  buffer._M_elems[9] = '\0';
  buffer._M_elems[10] = '\0';
  buffer._M_elems[0xb] = '\0';
  buffer._M_elems[0xc] = '\0';
  buffer._M_elems[0xd] = '\0';
  buffer._M_elems[0xe] = '\0';
  buffer._M_elems[0xf] = '\0';
  buffer._M_elems[0x10] = '\0';
  buffer._M_elems[0x11] = '\0';
  buffer._M_elems[0x12] = '\0';
  buffer._M_elems[0x13] = '\0';
  buffer._M_elems[0x14] = '\0';
  buffer._M_elems[0x15] = '\0';
  buffer._M_elems[0x16] = '\0';
  buffer._M_elems[0x17] = '\0';
  acStack_158[0] = '\0';
  acStack_158[1] = '\0';
  acStack_158[2] = '\0';
  acStack_158[3] = '\0';
  acStack_158[4] = '\0';
  acStack_158[5] = '\0';
  acStack_158[6] = '\0';
  acStack_158[7] = '\0';
  buffer._M_elems[0] = '\0';
  buffer._M_elems[1] = '\0';
  buffer._M_elems[2] = '\0';
  buffer._M_elems[3] = '\0';
  buffer._M_elems[4] = '\0';
  buffer._M_elems[5] = '\0';
  buffer._M_elems[6] = '\0';
  buffer._M_elems[7] = '\0';
  local_50 = &result._M_string_length;
  result._M_dataplus._M_p = (pointer)0x0;
  result._M_string_length._0_1_ = 0;
  __stream = popen((command->_M_dataplus)._M_p,"r");
  if (__stream == (FILE *)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"popen() failed!");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = feof(__stream);
  if (iVar1 == 0) {
    do {
      pcVar2 = fgets(acStack_158,0x80,__stream);
      if (pcVar2 != (char *)0x0) {
        std::__cxx11::string::append((char *)&local_50);
      }
      iVar1 = feof(__stream);
    } while (iVar1 == 0);
  }
  iVar1 = pclose(__stream);
  if (iVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_50,result._M_dataplus._M_p + (long)local_50);
    if (local_50 != &result._M_string_length) {
      operator_delete(local_50,CONCAT71(result._M_string_length._1_7_,
                                        (undefined1)result._M_string_length) + 1);
    }
    return __return_storage_ptr__;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_b0,"[ERROR] Execution of command ",command);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_70._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_70._M_dataplus._M_p == psVar5) {
    local_70.field_2._M_allocated_capacity = *psVar5;
    local_70.field_2._8_8_ = plVar4[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar5;
  }
  local_70._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::to_string(&local_90,iVar1);
  std::operator+(&local_d0,&local_70,&local_90);
  std::runtime_error::runtime_error(prVar3,(string *)&local_d0);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string systemWithOutput(const std::string& command)
{
    std::array<char, 128> buffer{};
    std::string result;

    auto pipe = popen(command.c_str(), "r"); // get rid of shared_ptr

    if (!pipe) throw std::runtime_error("popen() failed!");

    while (!feof(pipe)) {
        if (fgets(buffer.data(), 128, pipe) != nullptr)
            result += buffer.data();
    }

    auto status = pclose(pipe);

    if (status == EXIT_SUCCESS)
        return std::string(result);
    else
        throw std::runtime_error("[ERROR] Execution of command " + command + " exited with " + std::to_string(status));
}